

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O0

_Bool normalize_overflow(int *tensptr,int *unitsptr,int base)

{
  _Bool _Var1;
  undefined4 local_24;
  int tensdelta;
  int base_local;
  int *unitsptr_local;
  int *tensptr_local;
  
  if (*unitsptr < 0) {
    local_24 = -1 - (-1 - *unitsptr) / base;
  }
  else {
    local_24 = *unitsptr / base;
  }
  *unitsptr = *unitsptr - local_24 * base;
  _Var1 = _PDCLIB_increment_overflow(tensptr,local_24);
  return _Var1;
}

Assistant:

static bool normalize_overflow( int * tensptr, int * unitsptr, int base )
{
    int tensdelta;

    tensdelta = ( *unitsptr >= 0 ) ?
        ( *unitsptr / base ) :
        ( -1 - ( -1 - *unitsptr ) / base );
    *unitsptr -= tensdelta * base;
    return _PDCLIB_increment_overflow( tensptr, tensdelta );
}